

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O0

ErrorNumber callWithDefaults(char *funcName,double *input,int *input_int,int size)

{
  TA_InputParameterType TVar1;
  TA_RetCode TVar2;
  TA_Integer *in_RDX;
  TA_ParamHolder *in_RSI;
  int lookback;
  int outNbElement;
  int outBegIdx;
  int j;
  uint i;
  TA_RetCode retCode;
  TA_OutputParameterInfo *outputInfo;
  TA_InputParameterInfo *inputInfo;
  TA_FuncInfo *funcInfo;
  TA_FuncHandle *handle;
  TA_ParamHolder *paramHolder;
  TA_ParamHolder *in_stack_ffffffffffffff40;
  TA_ParamHolder *in_stack_ffffffffffffff48;
  TA_ParamHolder *in_stack_ffffffffffffff50;
  TA_ParamHolder *in_stack_ffffffffffffff58;
  TA_ParamHolder *in_stack_ffffffffffffff60;
  TA_ParamHolder *in_stack_ffffffffffffff68;
  TA_ParamHolder *local_90;
  TA_ParamHolder **in_stack_ffffffffffffff80;
  TA_ParamHolder *open;
  TA_FuncHandle *in_stack_ffffffffffffff88;
  uint local_68;
  uint local_60;
  int local_5c;
  uint local_58;
  TA_OutputParameterInfo *local_50;
  TA_InputParameterInfo *local_48;
  TA_FuncInfo *local_40;
  TA_FuncHandle *local_38;
  TA_ParamHolder *local_30;
  TA_Integer *local_20;
  TA_ParamHolder *local_18;
  ErrorNumber local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  TVar2 = TA_GetFuncHandle((char *)in_stack_ffffffffffffff58,
                           (TA_FuncHandle **)in_stack_ffffffffffffff50);
  if (TVar2 == TA_SUCCESS) {
    TVar2 = TA_ParamHolderAlloc(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    if (TVar2 == TA_SUCCESS) {
      TA_GetFuncInfo(local_38,&local_40);
      local_90 = in_stack_ffffffffffffff68;
      for (local_58 = 0; local_58 < local_40->nbInput; local_58 = local_58 + 1) {
        TA_GetInputParameterInfo(local_38,local_58,&local_48);
        TVar1 = local_48->type;
        if (TVar1 == TA_Input_Price) {
          open = local_18;
          if ((local_48->flags & 1U) == 0) {
            open = (TA_ParamHolder *)0x0;
          }
          if ((local_48->flags & 2U) == 0) {
            local_90 = (TA_ParamHolder *)0x0;
          }
          else {
            local_90 = local_18;
          }
          in_stack_ffffffffffffff58 = local_18;
          if ((local_48->flags & 4U) == 0) {
            in_stack_ffffffffffffff58 = (TA_ParamHolder *)0x0;
          }
          in_stack_ffffffffffffff48 = local_18;
          if ((local_48->flags & 8U) == 0) {
            in_stack_ffffffffffffff48 = (TA_ParamHolder *)0x0;
          }
          in_stack_ffffffffffffff40 = local_18;
          if ((local_48->flags & 0x10U) == 0) {
            in_stack_ffffffffffffff40 = (TA_ParamHolder *)0x0;
          }
          in_stack_ffffffffffffff50 = in_stack_ffffffffffffff48;
          in_stack_ffffffffffffff60 = in_stack_ffffffffffffff58;
          TA_SetInputParamPricePtr
                    (local_30,local_58,(TA_Real *)open,(TA_Real *)local_90,
                     (TA_Real *)in_stack_ffffffffffffff58,(TA_Real *)in_stack_ffffffffffffff48,
                     (TA_Real *)in_stack_ffffffffffffff40,(TA_Real *)0x0);
        }
        else if (TVar1 == TA_Input_Real) {
          TA_SetInputParamRealPtr(local_30,local_58,(TA_Real *)local_18);
        }
        else if (TVar1 == TA_Input_Integer) {
          TA_SetInputParamIntegerPtr(local_30,local_58,local_20);
        }
      }
      for (local_58 = 0; local_58 < local_40->nbOutput; local_58 = local_58 + 1) {
        TA_GetOutputParameterInfo(local_38,local_58,&local_50);
        if (local_50->type == TA_Output_Real) {
          TA_SetOutputParamRealPtr(local_30,local_58,output[local_58]);
          for (local_5c = 0; local_5c < 2000; local_5c = local_5c + 1) {
            output[local_58][local_5c] = -3e+37;
          }
        }
        else if (local_50->type == TA_Output_Integer) {
          TA_SetOutputParamIntegerPtr(local_30,local_58,output_int[local_58]);
          for (local_5c = 0; local_5c < 2000; local_5c = local_5c + 1) {
            output_int[local_58][local_5c] = -0x7fffffff;
          }
        }
      }
      TVar2 = TA_CallFunc(local_90,(TA_Integer)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (TA_Integer)in_stack_ffffffffffffff60,
                          (TA_Integer *)in_stack_ffffffffffffff58,
                          (TA_Integer *)in_stack_ffffffffffffff50);
      if (TVar2 == TA_SUCCESS) {
        TVar2 = TA_GetLookback(in_stack_ffffffffffffff48,(TA_Integer *)in_stack_ffffffffffffff40);
        if (TVar2 == TA_SUCCESS) {
          if (local_60 == local_68) {
            TVar2 = TA_CallFunc(local_90,(TA_Integer)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                (TA_Integer)in_stack_ffffffffffffff60,
                                (TA_Integer *)in_stack_ffffffffffffff58,
                                (TA_Integer *)in_stack_ffffffffffffff50);
            if (TVar2 == TA_SUCCESS) {
              if (local_60 == 0) {
                TVar2 = TA_ParamHolderFree(in_stack_ffffffffffffff48);
                if (TVar2 == TA_SUCCESS) {
                  local_4 = TA_TEST_PASS;
                }
                else {
                  printf("TA_ParamHolderFree failed [%d]\n",(ulong)TVar2);
                  local_4 = TA_ABS_TST_FAIL_PARAMHOLDERFREE;
                }
              }
              else {
                printf("failed outBegIdx=%d when startIdx==endIdx==0\n",(ulong)local_60);
                TA_ParamHolderFree(in_stack_ffffffffffffff48);
                local_4 = TA_ABS_TST_FAIL_STARTEND_ZERO;
              }
            }
            else {
              printf("TA_CallFunc() failed data test 4 [%d]\n",(ulong)TVar2);
              TA_ParamHolderFree(in_stack_ffffffffffffff48);
              local_4 = TA_ABS_TST_FAIL_CALLFUNC_4;
            }
          }
          else {
            printf("TA_GetLookback() != outBegIdx [%d != %d]\n",(ulong)local_68,(ulong)local_60);
            TA_ParamHolderFree(in_stack_ffffffffffffff48);
            local_4 = TA_ABS_TST_FAIL_CALLFUNC_3;
          }
        }
        else {
          printf("TA_GetLookback() failed zero data test [%d]\n",(ulong)TVar2);
          TA_ParamHolderFree(in_stack_ffffffffffffff48);
          local_4 = TA_ABS_TST_FAIL_CALLFUNC_2;
        }
      }
      else {
        printf("TA_CallFunc() failed zero data test [%d]\n",(ulong)TVar2);
        TA_ParamHolderFree(in_stack_ffffffffffffff48);
        local_4 = TA_ABS_TST_FAIL_CALLFUNC_1;
      }
    }
    else {
      printf("Can\'t allocate the param holder [%d]\n",(ulong)TVar2);
      local_4 = TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
    }
  }
  else {
    printf("Can\'t get the function handle [%d]\n",(ulong)TVar2);
    local_4 = TA_ABS_TST_FAIL_GETFUNCHANDLE;
  }
  return local_4;
}

Assistant:

static ErrorNumber callWithDefaults( const char *funcName, const double *input, const int *input_int, int size )
{
   TA_ParamHolder *paramHolder;
   const TA_FuncHandle *handle;
   const TA_FuncInfo *funcInfo;
   const TA_InputParameterInfo *inputInfo;
   const TA_OutputParameterInfo *outputInfo;

   TA_RetCode retCode;
   unsigned int i;
   int j;
   int outBegIdx, outNbElement, lookback;

   retCode = TA_GetFuncHandle( funcName, &handle );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't get the function handle [%d]\n", retCode );
      return TA_ABS_TST_FAIL_GETFUNCHANDLE;
   }

   retCode = TA_ParamHolderAlloc( handle, &paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't allocate the param holder [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
   }

   TA_GetFuncInfo( handle, &funcInfo );

   for( i=0; i < funcInfo->nbInput; i++ )
   {
      TA_GetInputParameterInfo( handle, i, &inputInfo );
	  switch(inputInfo->type)
	  {
	  case TA_Input_Price:
         TA_SetInputParamPricePtr( paramHolder, i,
			 inputInfo->flags&TA_IN_PRICE_OPEN?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_HIGH?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_LOW?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_CLOSE?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_VOLUME?input:NULL, NULL );
		 break;
	  case TA_Input_Real:
         TA_SetInputParamRealPtr( paramHolder, i, input );
		 break;
	  case TA_Input_Integer:
         TA_SetInputParamIntegerPtr( paramHolder, i, input_int );
         break;
	  }
   }

   for( i=0; i < funcInfo->nbOutput; i++ )
   {
      TA_GetOutputParameterInfo( handle, i, &outputInfo );
	  switch(outputInfo->type)
	  {
	  case TA_Output_Real:
	     TA_SetOutputParamRealPtr(paramHolder,i,&output[i][0]);
         for( j=0; j < 2000; j++ )
            output[i][j] = TA_REAL_MIN;
		 break;
	  case TA_Output_Integer:
	     TA_SetOutputParamIntegerPtr(paramHolder,i,&output_int[i][0]);
         for( j=0; j < 2000; j++ )
            output_int[i][j] = TA_INTEGER_MIN;
		 break;
	  }
   }

   /* Do the function call. */
   retCode = TA_CallFunc(paramHolder,0,size-1,&outBegIdx,&outNbElement);
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_CallFunc() failed zero data test [%d]\n", retCode );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_1;
   }

   /* Verify consistency with Lookback */
   retCode = TA_GetLookback( paramHolder, &lookback );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_GetLookback() failed zero data test [%d]\n", retCode );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_2;
   }

   if( outBegIdx != lookback )
   {
      printf( "TA_GetLookback() != outBegIdx [%d != %d]\n", lookback, outBegIdx );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_3;
   }

   /* TODO Add back nan/inf tests.
   for( i=0; i < funcInfo->nbOutput; i++ )
   {
	  switch(outputInfo->type)
	  {
	  case TA_Output_Real:
		for( j=0; j < outNbElement; j++ )
		{
			if( trio_isnan(output[i][j]) ||
                trio_isinf(output[i][j]))
			{
				printf( "Failed for output[%d][%d] = %e\n", i, j, output[i][j] );
				return TA_ABS_TST_FAIL_INVALID_OUTPUT;
			}
		}
		break;
	  case TA_Output_Integer:
		break;
	  }
   }*/

   /* Do another function call where startIdx == endIdx == 0.
    * In that case, outBegIdx should ALWAYS be zero.
    */
   retCode = TA_CallFunc(paramHolder,0,0,&outBegIdx,&outNbElement);
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_CallFunc() failed data test 4 [%d]\n", retCode );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_4;
   }

   if( outBegIdx != 0 )
   {
      printf( "failed outBegIdx=%d when startIdx==endIdx==0\n", outBegIdx );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_STARTEND_ZERO;
   }

   retCode = TA_ParamHolderFree( paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_ParamHolderFree failed [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
   }

   return TA_TEST_PASS;
}